

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O2

HaF32 * __thiscall
HACD::MyWuQuantizer::kmeansQuantize3D
          (MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices,bool denormalizeResults,
          HaU32 maxVertices,HaU32 *outputCount)

{
  Vec3Vector *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  uint uVar6;
  Vec3d<float> *_input;
  Vec3d<float> *clusters;
  HaU32 *outputIndices;
  Vec3 *input;
  Vec3 *pVVar7;
  undefined7 in_register_00000009;
  HaU32 i_1;
  ulong uVar8;
  Vec3d<float> *_output;
  HaU32 i;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Vec3 local_48;
  undefined4 local_3c;
  vector<HACD::Vec3> *local_38;
  
  *outputCount = 0;
  (this->mNormalizedInput).mSize = 0;
  (this->mQuantizedOutput).mSize = 0;
  if (vcount == 0) {
    pVVar7 = (Vec3 *)0x0;
  }
  else {
    local_38 = &this->mNormalizedInput;
    local_3c = (undefined4)CONCAT71(in_register_00000009,denormalizeResults);
    normalizeInput(this,vcount,vertices);
    clusters = (Vec3d<float> *)malloc((ulong)vcount * 0xc);
    outputIndices = (HaU32 *)malloc((ulong)vcount << 2);
    pVVar7 = (Vec3 *)0x0;
    input = hacd::vector<HACD::Vec3>::operator[](local_38,0);
    uVar6 = kmeans_cluster<HACD::Vec3d<float>,float>
                      ((Vec3d<float> *)input,vcount,maxVertices,clusters,outputIndices,0.01,0.0001);
    *outputCount = uVar6;
    if (uVar6 != 0) {
      this_00 = &this->mQuantizedOutput;
      if ((char)local_3c == '\0') {
        uVar9 = 0;
        for (uVar8 = 0; uVar8 < uVar6; uVar8 = uVar8 + 1) {
          local_48.z = (HaF32)(&clusters->z)[uVar9 & 0xffffffff];
          local_48.x = (HaF32)*(undefined8 *)(&clusters->x + (uVar9 & 0xffffffff));
          local_48.y = (HaF32)((ulong)*(undefined8 *)(&clusters->x + (uVar9 & 0xffffffff)) >> 0x20);
          hacd::vector<HACD::Vec3>::push_back(this_00,&local_48);
          uVar6 = *outputCount;
          uVar9 = uVar9 + 3;
        }
      }
      else {
        uVar8 = 0;
        for (uVar9 = 0; uVar9 < uVar6; uVar9 = uVar9 + 1) {
          auVar10 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).x),
                                    ZEXT416((uint)(&clusters->x)[uVar8 & 0xffffffff]),
                                    ZEXT416((uint)(this->mCenter).x));
          auVar11._0_4_ = auVar10._0_4_;
          auVar11._4_4_ = auVar11._0_4_;
          auVar11._8_4_ = auVar11._0_4_;
          auVar11._12_4_ = auVar11._0_4_;
          uVar1 = (this->mScale).y;
          uVar4 = (this->mScale).z;
          auVar10._4_4_ = uVar4;
          auVar10._0_4_ = uVar1;
          auVar10._8_8_ = 0;
          uVar2 = (this->mCenter).y;
          uVar5 = (this->mCenter).z;
          auVar12._4_4_ = uVar5;
          auVar12._0_4_ = uVar2;
          auVar12._8_8_ = 0;
          auVar10 = vfmadd213ps_fma(auVar11,auVar10,auVar12);
          uVar3 = vmovlps_avx(auVar10);
          local_48.y = (HaF32)uVar3;
          local_48.z = (HaF32)((ulong)uVar3 >> 0x20);
          local_48.x = auVar11._0_4_;
          hacd::vector<HACD::Vec3>::push_back(this_00,&local_48);
          uVar6 = *outputCount;
          uVar8 = uVar8 + 3;
        }
      }
      pVVar7 = hacd::vector<HACD::Vec3>::operator[](this_00,0);
    }
    free(clusters);
    free(outputIndices);
  }
  return &pVVar7->x;
}

Assistant:

virtual const hacd::HaF32 * kmeansQuantize3D(hacd::HaU32 vcount,
		const hacd::HaF32 *vertices,
		bool denormalizeResults,
		hacd::HaU32 maxVertices,
		hacd::HaU32 &outputCount)
	{
		const hacd::HaF32 *ret = NULL;
		outputCount = 0;
		mNormalizedInput.clear();
		mQuantizedOutput.clear();

		if ( vcount > 0 )
		{
			normalizeInput(vcount,vertices);
			HaF32 *quantizedOutput = (HaF32 *)HACD_ALLOC( sizeof(HaF32)*3*vcount);
			HaU32 *quantizedIndices = (HaU32 *)HACD_ALLOC( sizeof(HaU32)*vcount );
			outputCount = kmeans_cluster3d(&mNormalizedInput[0].x, vcount, maxVertices, quantizedOutput, quantizedIndices, 0.01f, 0.0001f );
			if ( outputCount > 0 )
			{
				if ( denormalizeResults )
				{
					for (HaU32 i=0; i<outputCount; i++)
					{
						Vec3 v( &quantizedOutput[i*3] );
						v.x = v.x*mScale.x + mCenter.x;
						v.y = v.x*mScale.y + mCenter.y;
						v.z = v.x*mScale.z + mCenter.z;
						mQuantizedOutput.push_back(v);
					}
				}
				else
				{
					for (HaU32 i=0; i<outputCount; i++)
					{
						Vec3 v( &quantizedOutput[i*3] );
						mQuantizedOutput.push_back(v);
					}
				}
				ret = &mQuantizedOutput[0].x;
			}
			HACD_FREE(quantizedOutput);
			HACD_FREE(quantizedIndices);
		}

		return ret;
	}